

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unparser.cc
# Opt level: O0

Status __thiscall
google::protobuf::json_internal::anon_unknown_4::
WriteMessage<google::protobuf::json_internal::UnparseProto2Descriptor>
          (anon_unknown_4 *this,JsonWriter *writer,
          Msg<google::protobuf::json_internal::UnparseProto2Descriptor> *msg,
          Desc<google::protobuf::json_internal::UnparseProto2Descriptor> *desc,bool is_top_level)

{
  Desc<google::protobuf::json_internal::UnparseProto2Descriptor> *pDVar1;
  Msg<google::protobuf::json_internal::UnparseProto2Descriptor> *pMVar2;
  bool bVar3;
  MessageType MVar4;
  size_t sVar5;
  string_view name;
  string_view local_88;
  uint local_78;
  byte local_62;
  bool local_61;
  undefined1 auStack_60 [7];
  bool first;
  Field<google::protobuf::json_internal::UnparseProto2Descriptor> local_48;
  Field field;
  byte local_29;
  Desc<google::protobuf::json_internal::UnparseProto2Descriptor> *pDStack_28;
  bool is_top_level_local;
  Desc<google::protobuf::json_internal::UnparseProto2Descriptor> *desc_local;
  Msg<google::protobuf::json_internal::UnparseProto2Descriptor> *msg_local;
  JsonWriter *writer_local;
  Status *_status;
  
  local_29 = is_top_level;
  pDStack_28 = desc;
  desc_local = (Desc<google::protobuf::json_internal::UnparseProto2Descriptor> *)msg;
  msg_local = (Msg<google::protobuf::json_internal::UnparseProto2Descriptor> *)writer;
  writer_local = (JsonWriter *)this;
  _field = Proto2Descriptor::TypeName(desc);
  name._M_str = field._8_8_;
  name._M_len = (size_t)name._M_str;
  MVar4 = ClassifyMessage((json_internal *)field,name);
  pMVar2 = msg_local;
  pDVar1 = pDStack_28;
  switch(MVar4) {
  case kAny:
    WriteAny<google::protobuf::json_internal::UnparseProto2Descriptor>
              (this,(JsonWriter *)msg_local,
               (Msg<google::protobuf::json_internal::UnparseProto2Descriptor> *)desc_local,
               pDStack_28);
    break;
  case kWrapper:
    JsonLocation::SourceLocation::current();
    local_48 = Proto2Descriptor::MustHaveField(pDVar1,1);
    sVar5 = UnparseProto2Descriptor::GetSize(local_48,(Msg *)desc_local);
    if (sVar5 == 0) {
      WriteSingular<google::protobuf::json_internal::UnparseProto2Descriptor>
                (this,(JsonWriter *)msg_local,local_48);
    }
    else {
      (anonymous_namespace)::
      WriteSingular<google::protobuf::json_internal::UnparseProto2Descriptor,google::protobuf::Message_const&>
                ((_anonymous_namespace_ *)this,(JsonWriter *)msg_local,local_48,
                 (Message *)desc_local);
    }
    break;
  case kStruct:
    WriteStructValue<google::protobuf::json_internal::UnparseProto2Descriptor>
              (this,(JsonWriter *)msg_local,
               (Msg<google::protobuf::json_internal::UnparseProto2Descriptor> *)desc_local,
               pDStack_28);
    break;
  case kList:
    WriteListValue<google::protobuf::json_internal::UnparseProto2Descriptor>
              (this,(JsonWriter *)msg_local,
               (Msg<google::protobuf::json_internal::UnparseProto2Descriptor> *)desc_local,
               pDStack_28);
    break;
  case kValue:
    WriteValue<google::protobuf::json_internal::UnparseProto2Descriptor>
              (this,(JsonWriter *)msg_local,
               (Msg<google::protobuf::json_internal::UnparseProto2Descriptor> *)desc_local,
               pDStack_28,(bool)(local_29 & 1));
    break;
  default:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)auStack_60,"{");
    JsonWriter::Write((JsonWriter *)pMVar2,_auStack_60);
    JsonWriter::Push((JsonWriter *)msg_local);
    local_61 = true;
    local_62 = 0;
    WriteFields<google::protobuf::json_internal::UnparseProto2Descriptor>
              (this,(JsonWriter *)msg_local,
               (Msg<google::protobuf::json_internal::UnparseProto2Descriptor> *)desc_local,
               pDStack_28,&local_61);
    bVar3 = absl::lts_20240722::Status::ok((Status *)this);
    bVar3 = ((bVar3 ^ 0xffU) & 1) != 0;
    if (bVar3) {
      local_62 = 1;
    }
    local_78 = (uint)bVar3;
    if ((local_62 & 1) == 0) {
      absl::lts_20240722::Status::~Status((Status *)this);
    }
    if (local_78 == 0) {
      JsonWriter::Pop((JsonWriter *)msg_local);
      if ((local_61 & 1U) == 0) {
        JsonWriter::NewLine((JsonWriter *)msg_local);
      }
      pMVar2 = msg_local;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_88,"}");
      JsonWriter::Write((JsonWriter *)pMVar2,local_88);
      absl::lts_20240722::OkStatus();
    }
    break;
  case kTimestamp:
    WriteTimestamp<google::protobuf::json_internal::UnparseProto2Descriptor>
              (this,(JsonWriter *)msg_local,
               (Msg<google::protobuf::json_internal::UnparseProto2Descriptor> *)desc_local,
               pDStack_28);
    break;
  case kDuration:
    WriteDuration<google::protobuf::json_internal::UnparseProto2Descriptor>
              (this,(JsonWriter *)msg_local,
               (Msg<google::protobuf::json_internal::UnparseProto2Descriptor> *)desc_local,
               pDStack_28);
    break;
  case kFieldMask:
    WriteFieldMask<google::protobuf::json_internal::UnparseProto2Descriptor>
              (this,(JsonWriter *)msg_local,
               (Msg<google::protobuf::json_internal::UnparseProto2Descriptor> *)desc_local,
               pDStack_28);
  }
  return (Status)(uintptr_t)this;
}

Assistant:

absl::Status WriteMessage(JsonWriter& writer, const Msg<Traits>& msg,
                          const Desc<Traits>& desc, bool is_top_level) {
  switch (ClassifyMessage(Traits::TypeName(desc))) {
    case MessageType::kAny:
      return WriteAny<Traits>(writer, msg, desc);
    case MessageType::kWrapper: {
      auto field = Traits::MustHaveField(desc, 1);
      if (Traits::GetSize(field, msg) == 0) {
        return WriteSingular<Traits>(writer, field);
      }
      return WriteSingular<Traits>(writer, field, msg);
    }
    case MessageType::kValue:
      return WriteValue<Traits>(writer, msg, desc, is_top_level);
    case MessageType::kStruct:
      return WriteStructValue<Traits>(writer, msg, desc);
    case MessageType::kList:
      return WriteListValue<Traits>(writer, msg, desc);
    case MessageType::kTimestamp:
      return WriteTimestamp<Traits>(writer, msg, desc);
    case MessageType::kDuration:
      return WriteDuration<Traits>(writer, msg, desc);
    case MessageType::kFieldMask:
      return WriteFieldMask<Traits>(writer, msg, desc);
    default: {
      writer.Write("{");
      writer.Push();
      bool first = true;
      RETURN_IF_ERROR(WriteFields<Traits>(writer, msg, desc, first));
      writer.Pop();
      if (!first) {
        writer.NewLine();
      }
      writer.Write("}");
      return absl::OkStatus();
    }
  }
}